

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O0

void __thiscall sglr::ReferenceContext::enable(ReferenceContext *this,deUint32 cap)

{
  bool bVar1;
  ContextType CVar2;
  deUint32 cap_local;
  ReferenceContext *this_local;
  
  if (cap == 0xb71) {
    this->m_depthTestEnabled = true;
  }
  else if (cap == 0xb90) {
    this->m_stencilTestEnabled = true;
  }
  else if (cap != 0xbd0) {
    if (cap == 0xbe2) {
      this->m_blendEnabled = true;
    }
    else if (cap == 0xc11) {
      this->m_scissorEnabled = true;
    }
    else if (cap == 0x8037) {
      this->m_polygonOffsetFillEnabled = true;
    }
    else if (cap == 0x864f) {
      CVar2 = Context::getType(&this->super_Context);
      bVar1 = glu::isContextTypeGLCore(CVar2);
      if (bVar1) {
        this->m_depthClampEnabled = true;
      }
      else {
        setError(this,0x500);
      }
    }
    else if (cap == 0x8d69) {
      CVar2 = Context::getType(&this->super_Context);
      bVar1 = glu::isContextTypeGLCore(CVar2);
      if (bVar1) {
        setError(this,0x500);
      }
      else {
        this->m_primitiveRestartFixedIndex = true;
      }
    }
    else if (cap == 0x8db9) {
      CVar2 = Context::getType(&this->super_Context);
      bVar1 = glu::isContextTypeGLCore(CVar2);
      if (bVar1) {
        this->m_sRGBUpdateEnabled = true;
      }
      else {
        setError(this,0x500);
      }
    }
    else if (cap == 0x8f9d) {
      CVar2 = Context::getType(&this->super_Context);
      bVar1 = glu::isContextTypeGLCore(CVar2);
      if (bVar1) {
        this->m_primitiveRestartSettableIndex = true;
      }
      else {
        setError(this,0x500);
      }
    }
    else {
      setError(this,0x500);
    }
  }
  return;
}

Assistant:

void ReferenceContext::enable (deUint32 cap)
{
	switch (cap)
	{
		case GL_BLEND:					m_blendEnabled				= true;	break;
		case GL_SCISSOR_TEST:			m_scissorEnabled			= true;	break;
		case GL_DEPTH_TEST:				m_depthTestEnabled			= true;	break;
		case GL_STENCIL_TEST:			m_stencilTestEnabled		= true;	break;
		case GL_POLYGON_OFFSET_FILL:	m_polygonOffsetFillEnabled	= true;	break;

		case GL_FRAMEBUFFER_SRGB:
			if (glu::isContextTypeGLCore(getType()))
			{
				m_sRGBUpdateEnabled = true;
				break;
			}
			setError(GL_INVALID_ENUM);
			break;

		case GL_DEPTH_CLAMP:
			if (glu::isContextTypeGLCore(getType()))
			{
				m_depthClampEnabled = true;
				break;
			}
			setError(GL_INVALID_ENUM);
			break;

		case GL_DITHER:
			// Not implemented - just ignored.
			break;

		case GL_PRIMITIVE_RESTART_FIXED_INDEX:
			if (!glu::isContextTypeGLCore(getType()))
			{
				m_primitiveRestartFixedIndex = true;
				break;
			}
			setError(GL_INVALID_ENUM);
			break;

		case GL_PRIMITIVE_RESTART:
			if (glu::isContextTypeGLCore(getType()))
			{
				m_primitiveRestartSettableIndex = true;
				break;
			}
			setError(GL_INVALID_ENUM);
			break;

		default:
			setError(GL_INVALID_ENUM);
			break;
	}
}